

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O2

WebPMuxError MuxSet(WebPMux *mux,uint32_t tag,WebPData *data,int copy_data)

{
  CHUNK_INDEX CVar1;
  WebPMuxError WVar2;
  long lStack_50;
  WebPChunk chunk;
  
  CVar1 = ChunkGetIndexFromTag(tag);
  ChunkInit(&chunk);
  WVar2 = WEBP_MUX_NOT_FOUND;
  switch(CVar1) {
  case IDX_VP8X:
    WVar2 = ChunkAssignData(&chunk,data,copy_data,tag);
    if (WVar2 != WEBP_MUX_OK) {
      return WVar2;
    }
    lStack_50 = 0x28;
    break;
  case IDX_ICCP:
    WVar2 = ChunkAssignData(&chunk,data,copy_data,tag);
    if (WVar2 != WEBP_MUX_OK) {
      return WVar2;
    }
    lStack_50 = 8;
    break;
  case IDX_ANIM:
    WVar2 = ChunkAssignData(&chunk,data,copy_data,tag);
    if (WVar2 != WEBP_MUX_OK) {
      return WVar2;
    }
    lStack_50 = 0x20;
    break;
  default:
    goto switchD_0014060c_caseD_3;
  case IDX_EXIF:
    WVar2 = ChunkAssignData(&chunk,data,copy_data,tag);
    if (WVar2 != WEBP_MUX_OK) {
      return WVar2;
    }
    lStack_50 = 0x10;
    break;
  case IDX_XMP:
    WVar2 = ChunkAssignData(&chunk,data,copy_data,tag);
    if (WVar2 != WEBP_MUX_OK) {
      return WVar2;
    }
    lStack_50 = 0x18;
    break;
  case IDX_UNKNOWN:
    WVar2 = ChunkAssignData(&chunk,data,copy_data,tag);
    if (WVar2 != WEBP_MUX_OK) {
      return WVar2;
    }
    lStack_50 = 0x30;
  }
  WVar2 = ChunkSetHead(&chunk,(WebPChunk **)((long)&mux->images_ + lStack_50));
switchD_0014060c_caseD_3:
  return WVar2;
}

Assistant:

static WebPMuxError MuxSet(WebPMux* const mux, uint32_t tag,
                           const WebPData* const data, int copy_data) {
  WebPChunk chunk;
  WebPMuxError err = WEBP_MUX_NOT_FOUND;
  const CHUNK_INDEX idx = ChunkGetIndexFromTag(tag);
  assert(mux != NULL);
  assert(!IsWPI(kChunks[idx].id));

  ChunkInit(&chunk);
  SWITCH_ID_LIST(IDX_VP8X,    &mux->vp8x_);
  SWITCH_ID_LIST(IDX_ICCP,    &mux->iccp_);
  SWITCH_ID_LIST(IDX_ANIM,    &mux->anim_);
  SWITCH_ID_LIST(IDX_EXIF,    &mux->exif_);
  SWITCH_ID_LIST(IDX_XMP,     &mux->xmp_);
  SWITCH_ID_LIST(IDX_UNKNOWN, &mux->unknown_);
  return err;
}